

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

ON_RTreeListNode * __thiscall ON_RTreeMemPool::AllocListNode(ON_RTreeMemPool *this)

{
  size_t list_node_sz;
  ON_RTreeListNode *list_node;
  ON_RTreeMemPool *this_local;
  
  list_node_sz = (size_t)this->m_list_nodes;
  if ((Blk *)list_node_sz == (Blk *)0x0) {
    if (this->m_buffer_capacity < 0x10) {
      GrowBuffer(this);
    }
    list_node_sz = (size_t)this->m_buffer;
    if ((uchar *)list_node_sz != (uchar *)0x0) {
      this->m_buffer = this->m_buffer + 0x10;
      this->m_buffer_capacity = this->m_buffer_capacity - 0x10;
    }
  }
  else {
    this->m_list_nodes = this->m_list_nodes->m_next;
  }
  return (ON_RTreeListNode *)list_node_sz;
}

Assistant:

struct ON_RTreeListNode* ON_RTreeMemPool::AllocListNode()
{
  struct ON_RTreeListNode* list_node = (struct ON_RTreeListNode*)m_list_nodes;
  if ( list_node )
  {
    m_list_nodes = m_list_nodes->m_next;
  }
  else
  {
    size_t list_node_sz = sizeof(*list_node);
    if ( m_buffer_capacity < list_node_sz )
    {
      GrowBuffer();
    }
    list_node = (struct ON_RTreeListNode*)m_buffer;
    if ( list_node )
    {
      m_buffer += list_node_sz;
      m_buffer_capacity -= list_node_sz;
    }
  }
  return list_node;
}